

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O1

void __thiscall wabt::ExprVisitor::PushDefault(ExprVisitor *this,Expr *expr)

{
  pointer *pppEVar1;
  iterator __position;
  iterator __position_00;
  Expr *local_20;
  Expr *expr_local;
  
  expr_local._4_4_ = 0;
  __position._M_current =
       (this->state_stack_).
       super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_20 = expr;
  if (__position._M_current ==
      (this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>::
    _M_realloc_insert<wabt::ExprVisitor::State>
              (&this->state_stack_,__position,(State *)((long)&expr_local + 4));
  }
  else {
    *__position._M_current = Default;
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  __position_00._M_current =
       (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::Expr*,std::allocator<wabt::Expr*>>::_M_realloc_insert<wabt::Expr*&>
              ((vector<wabt::Expr*,std::allocator<wabt::Expr*>> *)&this->expr_stack_,__position_00,
               &local_20);
  }
  else {
    *__position_00._M_current = local_20;
    pppEVar1 = &(this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  return;
}

Assistant:

void ExprVisitor::PushDefault(Expr* expr) {
  state_stack_.emplace_back(State::Default);
  expr_stack_.emplace_back(expr);
}